

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# focus_attack_strategy.cpp
# Opt level: O3

void __thiscall
FocusAttackStrategy::generateActions(FocusAttackStrategy *this,PlayerSight *sight,Actions *actions)

{
  Vec2 pos;
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  const_iterator __begin1;
  int *piVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  if ((this->super_Strategy).disabled == false) {
    piVar6 = *(int **)&sight->unitInSight;
    piVar1 = *(int **)&sight->field_0x80;
    if (piVar6 == piVar1) {
      iVar4 = -1;
    }
    else {
      iVar3 = this->target;
      iVar4 = -1;
      fVar7 = 1e+08;
      piVar5 = piVar6;
      do {
        if (*piVar5 == iVar3) goto LAB_00104987;
        fVar8 = (float)piVar5[1] - (sight->pos).x;
        fVar9 = (float)piVar5[2] - (sight->pos).y;
        fVar8 = SQRT(fVar8 * fVar8 + fVar9 * fVar9);
        iVar2 = *piVar5;
        if (fVar7 <= fVar8) {
          fVar8 = fVar7;
          iVar2 = iVar4;
        }
        iVar4 = iVar2;
        fVar7 = fVar8;
        piVar5 = piVar5 + 5;
      } while (piVar5 != piVar1);
    }
    iVar3 = iVar4;
    this->target = iVar3;
LAB_00104987:
    if (iVar3 != -1 && piVar6 != piVar1) {
      do {
        if (*piVar6 == this->target) {
          pos = *(Vec2 *)(piVar6 + 1);
          if ((sight->canSuckAttack == true) &&
             (fVar8 = pos.x - (sight->pos).x, fVar7 = pos.y - (sight->pos).y,
             SQRT(fVar8 * fVar8 + fVar7 * fVar7) <= 4.0)) {
            Actions::emplace(actions,SuckAttack,*piVar6,pos);
          }
          if (sight->canUseBomb == true) {
            if (sight->bombCount == 0) {
              Actions::emplace(actions,BuyItem,0,(Vec2)0x0);
            }
            Actions::emplace(actions,UseItem,0,pos);
          }
        }
        piVar6 = piVar6 + 5;
      } while (piVar6 != piVar1);
    }
  }
  return;
}

Assistant:

void FocusAttackStrategy::generateActions(const PlayerSight &sight, Actions *actions)
{
    CHECK_DISABLED

    bool found = false;
    float dist = FINF;
    int nearest = -1;
    for (auto uinfo : sight.unitInSight)
    {
        if (uinfo.id == target)
        {
            found = true;
            break;
        }
        if ((uinfo.pos - sight.pos).length() < dist)
        {
            dist = (uinfo.pos - sight.pos).length();
            nearest = uinfo.id;
        }
    }
    if (!found)
        target = nearest;
    if (target == -1)
        return;
    
    for (auto uinfo : sight.unitInSight)
    {
        if (uinfo.id != target)
            continue;
        if (sight.canSuckAttack && (uinfo.pos - sight.pos).length() <= SuckRange)
            actions->emplace(SuckAttack, target, uinfo.pos);
        if (sight.canUseBomb)
        {
            if (sight.bombCount == 0)
                actions->emplace(BuyItem, BombItem, Vec2());
            actions->emplace(UseItem, BombItem, uinfo.pos);
        }
    }
}